

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapid_json_serial_impl.cpp
# Opt level: O0

void rapid_json_serial_impl_serialize_value(value v,Value *json_v)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  value in_RSI;
  undefined8 in_RDI;
  string s_1;
  ostringstream ostream;
  Value json_inner_value_4;
  Value json_member_3;
  SizeType length_6;
  size_t size_6;
  throwable th;
  Value *json_map_3;
  Value stacktrace_value;
  Value stacktrace_member;
  Value code_value;
  Value code_member;
  Value label_value;
  Value label_member;
  Value message_value;
  Value message_member;
  exception ex;
  Value *json_map_2;
  SizeType length_5;
  size_t size_5;
  SizeType length_4;
  size_t size_4;
  SizeType length_3;
  size_t size_3;
  SizeType length_2;
  size_t size_2;
  Value json_inner_value_3;
  Value json_member_2;
  value *tupla_array;
  value tupla;
  size_t iterator_2;
  size_t map_size;
  value *value_map;
  Value *json_map_1;
  Value json_inner_value_2;
  value current_value;
  size_t iterator_1;
  size_t array_size;
  value *value_array;
  Value *json_array_1;
  Value json_inner_value_1;
  Value json_member_1;
  Value json_member;
  Value json_inner_value;
  char *data;
  size_t iterator;
  size_t size_1;
  void *buffer;
  Value json_array;
  Value *json_map;
  SizeType length_1;
  size_t size;
  char *str_6;
  double d;
  float f;
  long l;
  int i_1;
  int i;
  short s;
  SizeType length;
  char str_5 [1];
  uchar b;
  type_id id;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffae8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffaf0;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffaf8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffb00;
  SizeType SVar4;
  StringRefType *in_stack_fffffffffffffb08;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffb10;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this;
  int local_434;
  string local_430 [32];
  ostringstream local_410 [376];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_298;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_288;
  undefined4 local_274;
  undefined8 local_270;
  undefined8 local_268;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_260;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_258;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_248;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_238;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_228;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_218;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_208;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_1f8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_1e8;
  undefined8 local_1d8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_1d0;
  undefined4 local_1c4;
  undefined8 local_1c0;
  undefined4 local_1b4;
  undefined8 local_1b0;
  undefined4 local_1a4;
  undefined8 local_1a0;
  undefined4 local_194;
  undefined8 local_190;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_188;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_178;
  undefined8 local_168;
  undefined8 local_160;
  ulong local_158;
  ulong local_150;
  long local_148;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_140;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_138;
  undefined8 local_128;
  ulong local_120;
  ulong local_118;
  long local_110;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_108;
  GenericStringRef<char> local_100;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_f0;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_e0;
  GenericStringRef<char> local_d0;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_c0;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_b0;
  long local_a0;
  ulong local_98;
  ulong local_90;
  long local_78;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_70;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_60;
  int local_54;
  long local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_34;
  undefined8 local_30;
  undefined4 local_28;
  int local_24;
  short local_1e;
  undefined4 local_1c;
  undefined2 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffea;
  undefined1 in_stack_ffffffffffffffeb;
  
  iVar1 = value_type_id(in_RDI);
  if (iVar1 == 0) {
    value_to_bool(in_RDI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetBool(in_stack_fffffffffffffaf0,SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0));
  }
  else if (iVar1 == 1) {
    local_1c = 1;
    value_to_char(in_RDI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetString(in_stack_fffffffffffffb10,(Ch *)in_stack_fffffffffffffb08,
              (SizeType)((ulong)in_stack_fffffffffffffb00 >> 0x20));
  }
  else if (iVar1 == 2) {
    local_1e = value_to_short(in_RDI);
    local_24 = (int)local_1e;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetInt(in_stack_fffffffffffffaf0,(int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
  }
  else if (iVar1 == 3) {
    local_28 = value_to_int(in_RDI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetInt(in_stack_fffffffffffffaf0,(int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
  }
  else if (iVar1 == 4) {
    local_30 = value_to_long(in_RDI);
    log_write_impl_va("metacall",0x6c,"rapid_json_serial_impl_serialize_value",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/serials/rapid_json_serial/source/rapid_json_serial_impl.cpp"
                      ,2,
                      "Casting long to int64_t (posible incompatible types) in RapidJSON implementation"
                     );
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetInt64(in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8);
  }
  else if (iVar1 == 5) {
    local_34 = value_to_float(in_RDI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetFloat(in_stack_fffffffffffffaf0,(float)((ulong)in_stack_fffffffffffffae8 >> 0x20));
  }
  else if (iVar1 == 6) {
    local_40 = value_to_double(in_RDI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetDouble(in_stack_fffffffffffffaf0,(double)in_stack_fffffffffffffae8);
  }
  else if (iVar1 == 7) {
    local_48 = value_to_string(in_RDI);
    SVar4 = (SizeType)((ulong)in_stack_fffffffffffffb00 >> 0x20);
    local_50 = value_type_size(in_RDI);
    if (local_50 == 0) {
      local_434 = 0;
    }
    else {
      local_434 = (int)local_50 + -1;
    }
    local_54 = local_434;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetString(in_stack_fffffffffffffb10,(Ch *)in_stack_fffffffffffffb08,SVar4);
  }
  else if (iVar1 == 8) {
    local_60 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::SetObject(in_stack_fffffffffffffaf0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(in_stack_fffffffffffffaf0,(Type)((ulong)in_stack_fffffffffffffae8 >> 0x20));
    local_78 = value_to_buffer(in_RDI);
    local_90 = value_type_size(in_RDI);
    for (local_98 = 0; local_98 < local_90; local_98 = local_98 + 1) {
      local_a0 = local_78 + local_98;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffaf0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetUint(in_stack_fffffffffffffaf0,(uint)((ulong)in_stack_fffffffffffffae8 >> 0x20));
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_b0);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(in_stack_fffffffffffffaf0);
    rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_d0,(char (*) [5])"data");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetString(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_stack_fffffffffffffb00,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_c0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(in_stack_fffffffffffffaf0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(in_stack_fffffffffffffaf0);
    rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_100,(char (*) [7])"length");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetString(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetUint64(in_stack_fffffffffffffaf0,(uint64_t)in_stack_fffffffffffffae8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_stack_fffffffffffffb00,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_f0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_e0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_70);
  }
  else if (iVar1 == 9) {
    local_108 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::SetArray(in_stack_fffffffffffffaf0);
    local_110 = value_to_array(in_RDI);
    local_118 = value_type_count(in_RDI);
    for (local_120 = 0; local_120 < local_118; local_120 = local_120 + 1) {
      local_128 = *(undefined8 *)(local_110 + local_120 * 8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffaf0);
      rapid_json_serial_impl_serialize_value
                (in_RSI,(Value *)CONCAT44(iVar1,CONCAT13(in_stack_ffffffffffffffeb,
                                                         CONCAT12(in_stack_ffffffffffffffea,
                                                                  in_stack_ffffffffffffffe8))));
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_138);
    }
  }
  else if (iVar1 == 10) {
    local_140 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::SetObject(in_stack_fffffffffffffaf0);
    local_148 = value_to_map(in_RDI);
    local_150 = value_type_count(in_RDI);
    for (local_158 = 0; local_158 < local_150; local_158 = local_158 + 1) {
      local_160 = *(undefined8 *)(local_148 + local_158 * 8);
      local_168 = value_to_array(local_160);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffaf0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffaf0);
      rapid_json_serial_impl_serialize_value
                (in_RSI,(Value *)CONCAT44(iVar1,CONCAT13(in_stack_ffffffffffffffeb,
                                                         CONCAT12(in_stack_ffffffffffffffea,
                                                                  in_stack_ffffffffffffffe8))));
      rapid_json_serial_impl_serialize_value
                (in_RSI,(Value *)CONCAT44(iVar1,CONCAT13(in_stack_ffffffffffffffeb,
                                                         CONCAT12(in_stack_ffffffffffffffea,
                                                                  in_stack_ffffffffffffffe8))));
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(in_stack_fffffffffffffb00,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_188);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_178);
    }
  }
  else {
    SVar4 = (SizeType)((ulong)in_stack_fffffffffffffb00 >> 0x20);
    if (iVar1 == 0xc) {
      local_190 = 9;
      local_194 = 8;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetString(in_stack_fffffffffffffb10,(Ch *)in_stack_fffffffffffffb08,SVar4);
    }
    else if (iVar1 == 0xd) {
      local_1a0 = 0xb;
      local_1a4 = 10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetString(in_stack_fffffffffffffb10,(Ch *)in_stack_fffffffffffffb08,SVar4);
    }
    else if (iVar1 == 0xf) {
      local_1b0 = 8;
      local_1b4 = 7;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetString(in_stack_fffffffffffffb10,(Ch *)in_stack_fffffffffffffb08,SVar4);
    }
    else if (iVar1 == 0x10) {
      local_1c0 = 9;
      local_1c4 = 8;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetString(in_stack_fffffffffffffb10,(Ch *)in_stack_fffffffffffffb08,SVar4);
    }
    else if (iVar1 == 0x11) {
      local_1d0 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::SetObject(in_stack_fffffffffffffaf0);
      local_1d8 = value_to_exception(in_RDI);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffaf0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffaf0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetString(in_stack_fffffffffffffb10,(Ch *)in_stack_fffffffffffffb08,
                  (SizeType)((ulong)in_stack_fffffffffffffb00 >> 0x20));
      exception_message(local_1d8);
      pcVar2 = (char *)exception_message(local_1d8);
      strlen(pcVar2);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetString(in_stack_fffffffffffffb10,(Ch *)in_stack_fffffffffffffb08,
                  (SizeType)((ulong)in_stack_fffffffffffffb00 >> 0x20));
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(in_stack_fffffffffffffb00,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffaf0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffaf0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetString(in_stack_fffffffffffffb10,(Ch *)in_stack_fffffffffffffb08,
                  (SizeType)((ulong)in_stack_fffffffffffffb00 >> 0x20));
      exception_label(local_1d8);
      pcVar2 = (char *)exception_label(local_1d8);
      strlen(pcVar2);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetString(in_stack_fffffffffffffb10,(Ch *)in_stack_fffffffffffffb08,
                  (SizeType)((ulong)in_stack_fffffffffffffb00 >> 0x20));
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(in_stack_fffffffffffffb00,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffaf0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffaf0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetString(in_stack_fffffffffffffb10,(Ch *)in_stack_fffffffffffffb08,
                  (SizeType)((ulong)in_stack_fffffffffffffb00 >> 0x20));
      exception_error_code(local_1d8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetInt64(in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(in_stack_fffffffffffffb00,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffaf0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffaf0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetString(in_stack_fffffffffffffb10,(Ch *)in_stack_fffffffffffffb08,
                  (SizeType)((ulong)in_stack_fffffffffffffb00 >> 0x20));
      exception_stacktrace(local_1d8);
      pcVar2 = (char *)exception_stacktrace(local_1d8);
      strlen(pcVar2);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetString(in_stack_fffffffffffffb10,(Ch *)in_stack_fffffffffffffb08,
                  (SizeType)((ulong)in_stack_fffffffffffffb00 >> 0x20));
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(in_stack_fffffffffffffb00,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_258);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_248);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_238);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_228);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_218);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_208);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_1f8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_1e8);
    }
    else if (iVar1 == 0x12) {
      local_260 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::SetObject(in_stack_fffffffffffffaf0);
      local_268 = value_to_throwable(in_RDI);
      local_270 = 0x10;
      local_274 = 0xf;
      this = &local_288;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffaf0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue(in_stack_fffffffffffffaf0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetString(this,(Ch *)in_stack_fffffffffffffb08,
                  (SizeType)((ulong)in_stack_fffffffffffffb00 >> 0x20));
      throwable_value(local_268);
      rapid_json_serial_impl_serialize_value
                (in_RSI,(Value *)CONCAT44(iVar1,CONCAT13(in_stack_ffffffffffffffeb,
                                                         CONCAT12(in_stack_ffffffffffffffea,
                                                                  in_stack_ffffffffffffffe8))));
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(in_stack_fffffffffffffb00,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_298);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_288);
    }
    else if (iVar1 == 0xb) {
      std::__cxx11::ostringstream::ostringstream(local_410);
      pvVar3 = (void *)value_to_ptr(in_RDI);
      std::ostream::operator<<((ostream *)local_410,pvVar3);
      SVar4 = (SizeType)((ulong)pvVar3 >> 0x20);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::c_str();
      std::__cxx11::string::length();
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetString(in_stack_fffffffffffffb10,(Ch *)in_stack_fffffffffffffb08,SVar4);
      std::__cxx11::string::~string(local_430);
      std::__cxx11::ostringstream::~ostringstream(local_410);
    }
    else if (iVar1 == 0xe) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetNull(in_stack_fffffffffffffaf0);
    }
  }
  return;
}

Assistant:

void rapid_json_serial_impl_serialize_value(value v, rapidjson::Value *json_v)
{
	type_id id = value_type_id(v);

	if (id == TYPE_BOOL)
	{
		boolean b = value_to_bool(v);

		json_v->SetBool(b == 1L ? true : false);
	}
	else if (id == TYPE_CHAR)
	{
		char str[1];

		rapidjson::SizeType length = 1;

		str[0] = value_to_char(v);

		json_v->SetString(str, length);
	}
	else if (id == TYPE_SHORT)
	{
		short s = value_to_short(v);

		int i = (int)s;

		json_v->SetInt(i);
	}
	else if (id == TYPE_INT)
	{
		int i = value_to_int(v);

		json_v->SetInt(i);
	}
	else if (id == TYPE_LONG)
	{
		long l = value_to_long(v);

		log_write("metacall", LOG_LEVEL_WARNING, "Casting long to int64_t (posible incompatible types) in RapidJSON implementation");

		json_v->SetInt64(l);
	}
	else if (id == TYPE_FLOAT)
	{
		float f = value_to_float(v);

		json_v->SetFloat(f);
	}
	else if (id == TYPE_DOUBLE)
	{
		double d = value_to_double(v);

		json_v->SetDouble(d);
	}
	else if (id == TYPE_STRING)
	{
		const char *str = value_to_string(v);

		size_t size = value_type_size(v);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_BUFFER)
	{
		rapidjson::Value &json_map = json_v->SetObject();

		rapidjson::Value json_array(rapidjson::kArrayType);

		void *buffer = value_to_buffer(v);

		size_t size = value_type_size(v);

		for (size_t iterator = 0; iterator < size; ++iterator)
		{
			const char *data = (const char *)(((uintptr_t)buffer) + iterator);

			rapidjson::Value json_inner_value;

			json_inner_value.SetUint((unsigned int)*data);

			json_array.PushBack(json_inner_value, rapid_json_allocator);
		}

		// Set data
		{
			rapidjson::Value json_member;

			json_member.SetString("data");

			json_map.AddMember(json_member, json_array, rapid_json_allocator);
		}

		// Set length
		{
			rapidjson::Value json_member, json_inner_value;

			json_member.SetString("length");

			json_inner_value.SetUint64((uint64_t)size);

			json_map.AddMember(json_member, json_inner_value, rapid_json_allocator);
		}
	}
	else if (id == TYPE_ARRAY)
	{
		rapidjson::Value &json_array = json_v->SetArray();

		value *value_array = value_to_array(v);

		size_t array_size = value_type_count(v);

		for (size_t iterator = 0; iterator < array_size; ++iterator)
		{
			value current_value = value_array[iterator];

			rapidjson::Value json_inner_value;

			rapid_json_serial_impl_serialize_value(current_value, &json_inner_value);

			json_array.PushBack(json_inner_value, rapid_json_allocator);
		}
	}
	else if (id == TYPE_MAP)
	{
		rapidjson::Value &json_map = json_v->SetObject();

		value *value_map = value_to_map(v);

		size_t map_size = value_type_count(v);

		for (size_t iterator = 0; iterator < map_size; ++iterator)
		{
			value tupla = value_map[iterator];

			value *tupla_array = value_to_array(tupla);

			rapidjson::Value json_member, json_inner_value;

			rapid_json_serial_impl_serialize_value(tupla_array[0], &json_member);

			rapid_json_serial_impl_serialize_value(tupla_array[1], &json_inner_value);

			json_map.AddMember(json_member, json_inner_value, rapid_json_allocator);
		}
	}
	else if (id == TYPE_FUTURE)
	{
		/* TODO: Improve future serialization */
		static const char str[] = "[Future]";

		size_t size = sizeof(str);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_FUNCTION)
	{
		/* TODO: Improve function serialization */
		static const char str[] = "[Function]";

		size_t size = sizeof(str);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_CLASS)
	{
		/* TODO: Improve class serialization */
		static const char str[] = "[Class]";

		size_t size = sizeof(str);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_OBJECT)
	{
		/* TODO: Improve object serialization */
		static const char str[] = "[Object]";

		size_t size = sizeof(str);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_EXCEPTION)
	{
		rapidjson::Value &json_map = json_v->SetObject();

		exception ex = value_to_exception(v);

		rapidjson::Value message_member, message_value;
		static const char message_str[] = "message";

		message_member.SetString(message_str, (rapidjson::SizeType)(sizeof(message_str) - 1));
		message_value.SetString(exception_message(ex), strlen(exception_message(ex)));
		json_map.AddMember(message_member, message_value, rapid_json_allocator);

		rapidjson::Value label_member, label_value;
		static const char label_str[] = "label";

		label_member.SetString(label_str, (rapidjson::SizeType)(sizeof(label_str) - 1));
		label_value.SetString(exception_label(ex), strlen(exception_label(ex)));
		json_map.AddMember(label_member, label_value, rapid_json_allocator);

		rapidjson::Value code_member, code_value;
		static const char code_str[] = "code";

		code_member.SetString(code_str, (rapidjson::SizeType)(sizeof(code_str) - 1));
		code_value.SetInt64(exception_error_code(ex));
		json_map.AddMember(code_member, code_value, rapid_json_allocator);

		rapidjson::Value stacktrace_member, stacktrace_value;
		static const char stacktrace_str[] = "stacktrace";

		stacktrace_member.SetString(stacktrace_str, (rapidjson::SizeType)(sizeof(stacktrace_str) - 1));
		stacktrace_value.SetString(exception_stacktrace(ex), strlen(exception_stacktrace(ex)));
		json_map.AddMember(stacktrace_member, stacktrace_value, rapid_json_allocator);
	}
	else if (id == TYPE_THROWABLE)
	{
		rapidjson::Value &json_map = json_v->SetObject();

		throwable th = value_to_throwable(v);

		static const char str[] = "ExceptionThrown";

		size_t size = sizeof(str);

		rapidjson::SizeType length = (rapidjson::SizeType)(size - 1);

		rapidjson::Value json_member, json_inner_value;

		json_member.SetString(str, length);

		rapid_json_serial_impl_serialize_value(throwable_value(th), &json_inner_value);

		json_map.AddMember(json_member, json_inner_value, rapid_json_allocator);
	}
	else if (id == TYPE_PTR)
	{
		std::ostringstream ostream;

		ostream << value_to_ptr(v);

		std::string s = ostream.str();

		json_v->SetString(s.c_str(), (rapidjson::SizeType)s.length());
	}
	else if (id == TYPE_NULL)
	{
		json_v->SetNull();
	}
}